

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

void scale_references_fpmt(AV1_COMP *cpi,int *ref_buffers_used_map)

{
  BufferPool *pBVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  RefCntBuffer *pRVar5;
  ulong uVar6;
  RefCntBuffer *pRVar7;
  
  lVar2 = 1;
  do {
    if ((cpi->ref_frame_flags & (uint)""[lVar2]) == 0) {
      if (((cpi->oxcf).pass != AOM_RC_ONE_PASS) || (cpi->ppi->lap_enabled != 0)) goto LAB_001b68fe;
    }
    else {
      lVar3 = (long)(cpi->common).remapped_ref_idx[(int)lVar2 - 1];
      if ((lVar3 == -1) || ((cpi->common).ref_frame_map[lVar3] == (RefCntBuffer *)0x0)) {
LAB_001b68fe:
        cpi->scaled_ref_buf[lVar2 + -1] = (RefCntBuffer *)0x0;
      }
      else {
        lVar3 = (long)(cpi->common).remapped_ref_idx[(int)lVar2 - 1];
        if (lVar3 == -1) {
          pRVar5 = (RefCntBuffer *)0x0;
        }
        else {
          pRVar5 = (cpi->common).ref_frame_map[lVar3];
        }
        cpi->scaled_ref_buf[lVar2 + -1] = pRVar5;
        pBVar1 = (cpi->common).buffer_pool;
        uVar6 = (ulong)pBVar1->num_frame_bufs;
        if (uVar6 != 0) {
          pRVar7 = pBVar1->frame_bufs;
          uVar4 = 0;
          do {
            if (pRVar7 == pRVar5) {
              *ref_buffers_used_map = *ref_buffers_used_map | 1 << ((byte)uVar4 & 0x1f);
            }
            uVar4 = uVar4 + 1;
            pRVar7 = pRVar7 + 1;
          } while (uVar6 != uVar4);
        }
      }
    }
    lVar2 = lVar2 + 1;
    if (lVar2 == 8) {
      return;
    }
  } while( true );
}

Assistant:

static void scale_references_fpmt(AV1_COMP *cpi, int *ref_buffers_used_map) {
  AV1_COMMON *cm = &cpi->common;
  MV_REFERENCE_FRAME ref_frame;

  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    // Need to convert from AOM_REFFRAME to index into ref_mask (subtract 1).
    if (cpi->ref_frame_flags & av1_ref_frame_flag_list[ref_frame]) {
      const YV12_BUFFER_CONFIG *const ref =
          get_ref_frame_yv12_buf(cm, ref_frame);

      if (ref == NULL) {
        cpi->scaled_ref_buf[ref_frame - 1] = NULL;
        continue;
      }

      // FPMT does not support scaling yet.
      assert(ref->y_crop_width == cm->width &&
             ref->y_crop_height == cm->height);

      RefCntBuffer *buf = get_ref_frame_buf(cm, ref_frame);
      cpi->scaled_ref_buf[ref_frame - 1] = buf;
      for (int i = 0; i < cm->buffer_pool->num_frame_bufs; ++i) {
        if (&cm->buffer_pool->frame_bufs[i] == buf) {
          *ref_buffers_used_map |= (1 << i);
        }
      }
    } else {
      if (!has_no_stats_stage(cpi)) cpi->scaled_ref_buf[ref_frame - 1] = NULL;
    }
  }
}